

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateEntityNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,string_view scope,string_view name)

{
  initializer_list<unsigned_long> sizes;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  initializer_list<unsigned_long> sizes_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  _Optional_base<google::protobuf::internal::DescriptorNames,_true,_true> _Var4;
  optional<google::protobuf::internal::DescriptorNames> oVar5;
  size_type local_100;
  long local_f8;
  iterator local_f0;
  undefined8 local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> bStack_d0;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_c0;
  size_t local_b8;
  size_t local_b0;
  char *local_a8;
  iterator local_a0;
  size_type local_98;
  size_type local_90;
  size_type local_88;
  iterator local_80;
  undefined8 local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_t local_60;
  char *local_58;
  iterator local_50;
  size_type local_48;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_40;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  string_view name_local;
  string_view scope_local;
  undefined1 local_10;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)name._M_len;
  name_local._M_str = (char *)scope._M_len;
  local_40 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&name_local._M_str);
  if (bVar1) {
    local_70._M_len = (size_t)this_local;
    local_70._M_str = (char *)name_local._M_len;
    local_60 = 1;
    local_58 = "";
    local_50 = &local_70;
    local_48 = 2;
    local_90 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_88 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_80 = &local_90;
    local_78 = 2;
    bytes_00._M_len = local_48;
    bytes_00._M_array = local_50;
    sizes_00._M_len = 2;
    sizes_00._M_array = local_80;
    _Var4._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> =
         (_Optional_payload<google::protobuf::internal::DescriptorNames,_true,_true,_true>)
         CreateDescriptorNames(this,bytes_00,sizes_00);
    local_10 = _Var4._M_payload.
               super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged;
  }
  else {
    local_e0._M_len = (size_t)name_local._M_str;
    local_e0._M_str = scope._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&bStack_d0,".");
    local_c0 = this_local;
    local_b8 = name_local._M_len;
    local_b0 = 1;
    local_a8 = "";
    local_a0 = &local_e0;
    local_98 = 4;
    local_100 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&name_local._M_str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_f8 = sVar2 + 1 + sVar3;
    local_f0 = &local_100;
    local_e8 = 2;
    bytes._M_len = local_98;
    bytes._M_array = local_a0;
    sizes._M_len = 2;
    sizes._M_array = local_f0;
    _Var4._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> =
         (_Optional_payload<google::protobuf::internal::DescriptorNames,_true,_true,_true>)
         CreateDescriptorNames(this,bytes,sizes);
    local_10 = _Var4._M_payload.
               super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged;
  }
  scope_local._M_str =
       _Var4._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _M_payload;
  oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._9_7_ =
       _Var4._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _9_7_;
  oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged =
       (bool)local_10;
  oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload =
       (_Storage<google::protobuf::internal::DescriptorNames,_true>)scope_local._M_str;
  return (optional<google::protobuf::internal::DescriptorNames>)
         oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
}

Assistant:

std::optional<internal::DescriptorNames> AllocateEntityNames(
      absl::string_view scope, absl::string_view name) {
    static constexpr absl::string_view kNullChar("\0", 1);
    if (scope.empty()) {
      return CreateDescriptorNames({name, kNullChar},
                                   {name.size(), name.size()});
    } else {
      return CreateDescriptorNames(
          {scope, ".", name, kNullChar},
          {name.size(), scope.size() + 1 + name.size()});
    }
  }